

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall
soplex::SPxScaler<double>::maxRowRatio(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  int iVar1;
  SVectorBase<double> *this_00;
  undefined8 *puVar2;
  double *pdVar3;
  element_type *this_01;
  SPxScaler<double> *pSVar4;
  double p;
  double x;
  int j;
  double maxi;
  double mini;
  SVectorBase<double> *vec;
  int i;
  double pmax;
  SPxScaler<double> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  int local_3c;
  SPxScaler<double> *local_38;
  SPxScaler<double> *local_30;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2d4543),
      local_1c < iVar1; local_1c = local_1c + 1) {
    this_00 = SPxLPBase<double>::rowVector
                        ((SPxLPBase<double> *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    puVar2 = (undefined8 *)infinity();
    local_30 = (SPxScaler<double> *)*puVar2;
    local_38 = (SPxScaler<double> *)0x0;
    for (local_3c = 0; iVar1 = SVectorBase<double>::size(this_00), local_3c < iVar1;
        local_3c = local_3c + 1) {
      pdVar3 = SVectorBase<double>::value(this_00,local_3c);
      pSVar4 = (SPxScaler<double> *)spxAbs<double>(*pdVar3);
      tolerances(in_stack_ffffffffffffff58);
      this_01 = std::
                __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2d45fa);
      Tolerances::epsilon(this_01);
      in_stack_ffffffffffffff67 =
           isZero<double,double>
                     ((double)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      (double)in_stack_ffffffffffffff58);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2d4629);
      if ((in_stack_ffffffffffffff67 & 1) == 0) {
        if ((double)pSVar4 < (double)local_30) {
          local_30 = pSVar4;
        }
        if ((double)local_38 < (double)pSVar4) {
          local_38 = pSVar4;
        }
      }
    }
    in_stack_ffffffffffffff58 = local_30;
    pdVar3 = (double *)infinity();
    if ((((double)in_stack_ffffffffffffff58 != *pdVar3) ||
        (NAN((double)in_stack_ffffffffffffff58) || NAN(*pdVar3))) &&
       (local_18 < (double)local_38 / (double)local_30)) {
      local_18 = (double)local_38 / (double)local_30;
    }
  }
  return local_18;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}